

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlMemory.c
# Opt level: O1

char * JlStrDup(char *SourceString)

{
  size_t sVar1;
  char *pcVar2;
  
  if (SourceString == (char *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    sVar1 = strlen(SourceString);
    pcVar2 = (char *)WjTestLib_Calloc(sVar1 + 1,1);
    if (pcVar2 != (char *)0x0) {
      pcVar2 = (char *)memcpy(pcVar2,SourceString,sVar1 + 1);
      return pcVar2;
    }
  }
  return pcVar2;
}

Assistant:

char*
    JlStrDup
    (
        char const*     SourceString
    )
{
    char* newString = NULL;

    if( NULL != SourceString )
    {
        size_t stringSize = strlen( SourceString ) + 1;
        newString = JlAlloc( stringSize );
        if( NULL != newString )
        {
            memcpy( newString, SourceString, stringSize );
        }
    }

    return newString;
}